

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_ws.cpp
# Opt level: O2

void duckdb::ConcatWSFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  reference this;
  reference pvVar2;
  ulong uVar3;
  SelectionVector *rsel;
  idx_t col_idx;
  ulong uVar4;
  idx_t i;
  idx_t count;
  SelectionVector not_null_vector;
  UnifiedVectorFormat vdata;
  
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(this,args->count,&vdata);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  uVar4 = 0;
  do {
    if ((ulong)(((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= uVar4) goto LAB_0184343d;
    pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar4);
    uVar4 = uVar4 + 1;
  } while (pvVar2->vector_type == CONSTANT_VECTOR);
  Vector::SetVectorType(result,FLAT_VECTOR);
LAB_0184343d:
  if (this->vector_type == CONSTANT_VECTOR) {
    puVar1 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      rsel = FlatVector::IncrementalSelectionVector();
      TemplatedConcatWS(args,(string_t *)vdata.data,vdata.sel,rsel,args->count,result);
    }
    else {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    SelectionVector::SelectionVector(&not_null_vector,0x800);
    FlatVector::VerifyFlatVector(result);
    count = 0;
    for (uVar4 = 0; uVar4 < args->count; uVar4 = uVar4 + 1) {
      uVar3 = uVar4;
      if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(vdata.sel)->sel_vector[uVar4];
      }
      if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
           (uVar3 & 0x3f) & 1) != 0)) {
        not_null_vector.sel_vector[count] = (sel_t)uVar4;
        count = count + 1;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar4);
      }
    }
    TemplatedConcatWS(args,(string_t *)vdata.data,vdata.sel,&not_null_vector,count,result);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&not_null_vector.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  return;
}

Assistant:

static void ConcatWSFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &separator = args.data[0];
	UnifiedVectorFormat vdata;
	separator.ToUnifiedFormat(args.size(), vdata);

	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	for (idx_t col_idx = 0; col_idx < args.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			break;
		}
	}
	switch (separator.GetVectorType()) {
	case VectorType::CONSTANT_VECTOR: {
		if (ConstantVector::IsNull(separator)) {
			// constant NULL as separator: return constant NULL vector
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}
		// no null values
		auto sel = FlatVector::IncrementalSelectionVector();
		TemplatedConcatWS(args, UnifiedVectorFormat::GetData<string_t>(vdata), *vdata.sel, *sel, args.size(), result);
		return;
	}
	default: {
		// default case: loop over nullmask and create a non-null selection vector
		idx_t not_null_count = 0;
		SelectionVector not_null_vector(STANDARD_VECTOR_SIZE);
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t i = 0; i < args.size(); i++) {
			if (!vdata.validity.RowIsValid(vdata.sel->get_index(i))) {
				result_mask.SetInvalid(i);
			} else {
				not_null_vector.set_index(not_null_count++, i);
			}
		}
		TemplatedConcatWS(args, UnifiedVectorFormat::GetData<string_t>(vdata), *vdata.sel, not_null_vector,
		                  not_null_count, result);
		return;
	}
	}
}